

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedUniformLimitCase::iterate
          (CombinedUniformLimitCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  allocator<char> local_2c1;
  CallLogWrapper gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  string local_230;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  code *local_200;
  GLenum local_1f8;
  ResultCollector result;
  undefined1 local_1a0 [384];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0," // ERROR: ",(allocator<char> *)&local_2a8);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  gl.m_enableLog = true;
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"The minimum value of ");
  local_2a8._M_string_length._0_4_ = this->m_combined;
  local_2a8._M_dataplus._M_p = (pointer)glu::getGettableStateName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2a8,(ostream *)this_00);
  std::operator<<((ostream *)this_00," is ");
  section.m_log = (TestLog *)glu::getGettableStateName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&section,(ostream *)this_00);
  std::operator<<((ostream *)this_00," x MAX_UNIFORM_BLOCK_SIZE / 4 + ");
  local_268._M_string_length._0_4_ = this->m_defaultComponents;
  local_268._M_dataplus._M_p = (pointer)glu::getGettableStateName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_268,(ostream *)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformBlocks);
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_numBlocks,&maxUniformBlocks.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"Got Error ",(allocator<char> *)&maxUniformBlockSize);
    local_200 = glu::getErrorName;
    local_1f8 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_230,&local_200);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_268,&local_230);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_2a8,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_268);
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformBlockSize);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8a30,&maxUniformBlockSize.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"Got Error ",(allocator<char> *)&maxUniformComponents);
    local_200 = glu::getErrorName;
    local_1f8 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_230,&local_200);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_268,&local_230);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_2a8,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_268);
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformComponents);
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_defaultComponents,&maxUniformComponents.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"Got Error ",&local_2c1)
    ;
    local_200 = glu::getErrorName;
    local_1f8 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_230,&local_200);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_268,&local_230);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_2a8,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_268);
  }
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&maxUniformBlocks,&result);
  if (bVar2) {
    bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&maxUniformBlockSize,&result);
    if (bVar2) {
      bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&maxUniformComponents,&result);
      if (bVar2) {
        iVar3 = (maxUniformBlockSize.m_value * maxUniformBlocks.m_value) / 4 +
                maxUniformComponents.m_value;
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&result,&gl,this->m_combined,iVar3,QUERY_INTEGER);
        pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a0,"Types",(allocator<char> *)&local_268);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"Alternative queries",(allocator<char> *)&local_230);
        tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)local_1a0,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)local_1a0);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&result,&gl,this->m_combined,iVar3,QUERY_BOOLEAN);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&result,&gl,this->m_combined,iVar3,QUERY_INTEGER64);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&result,&gl,this->m_combined,iVar3,QUERY_FLOAT);
        tcu::ScopedLogSection::~ScopedLogSection(&section);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

CombinedUniformLimitCase::IterateResult CombinedUniformLimitCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of " << glu::getGettableStateStr(m_combined)
						<< " is " << glu::getGettableStateStr(m_numBlocks)
						<< " x MAX_UNIFORM_BLOCK_SIZE / 4 + "
						<< glu::getGettableStateStr(m_defaultComponents)
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(m_numBlocks, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(m_defaultComponents, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}